

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_scalar<ncnn::BinaryOp_x86_functor::binary_op_atan2>
              (Mat *a,float b,Mat *c,Option *opt)

{
  long *in_RSI;
  float *x;
  long *in_RDI;
  undefined4 in_XMM0_Da;
  float fVar1;
  undefined4 extraout_XMM0_Dc;
  float extraout_XMM0_Dd;
  __m128 afVar2;
  __m128 _p;
  __m128 _b;
  int i;
  float *outptr;
  float *ptr;
  int q;
  int size;
  int channels;
  binary_op_atan2 op;
  Mat *m;
  Mat *m_1;
  binary_op_atan2 *this;
  __m128 local_288;
  float local_278 [7];
  int local_25c;
  undefined8 local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined4 local_240;
  long local_238;
  undefined4 local_230;
  undefined4 local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  undefined8 local_218;
  float *local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  long local_1e8;
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined8 local_1c8;
  float *local_1c0;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  binary_op_atan2 local_1a9 [9];
  long *local_1a0;
  undefined4 local_194;
  long *local_190;
  undefined1 local_185;
  int local_184;
  undefined8 *local_178;
  undefined8 *local_170;
  undefined8 *local_160;
  binary_op_atan2 *local_158;
  undefined1 local_14d;
  int local_14c;
  undefined8 *local_140;
  undefined8 *local_130;
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  __m128 *pafStack_110;
  undefined8 local_108;
  float afStack_100 [2];
  float *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  float *local_d8;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  float *local_a0;
  undefined4 local_94;
  int local_90;
  int local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  binary_op_atan2 *local_48;
  undefined8 *local_38;
  
  local_1b0 = (int)in_RDI[7];
  local_1b4 = *(int *)((long)in_RDI + 0x2c) * (int)in_RDI[6] * *(int *)((long)in_RDI + 0x34) *
              (int)in_RDI[3];
  local_1a0 = in_RSI;
  local_194 = in_XMM0_Da;
  local_190 = in_RDI;
  for (local_1b8 = 0; local_1b8 < local_1b0; local_1b8 = local_1b8 + 1) {
    local_178 = &local_208;
    local_8c = *(int *)((long)local_190 + 0x2c);
    local_90 = (int)local_190[6];
    local_94 = *(undefined4 *)((long)local_190 + 0x34);
    local_1c0 = (float *)(*local_190 + local_190[8] * (long)local_1b8 * local_190[2]);
    local_a8 = local_190[2];
    local_ac = (undefined4)local_190[3];
    local_b8 = local_190[4];
    local_88 = &local_208;
    local_78 = (long)local_8c * (long)local_90 * local_a8;
    local_170 = &local_208;
    local_160 = &local_208;
    local_140 = &local_258;
    local_c4 = *(int *)((long)local_1a0 + 0x2c);
    local_c8 = (int)local_1a0[6];
    local_cc = *(undefined4 *)((long)local_1a0 + 0x34);
    x = (float *)(*local_1a0 + local_1a0[8] * (long)local_1b8 * local_1a0[2]);
    local_e0 = local_1a0[2];
    local_e4 = (undefined4)local_1a0[3];
    local_f0 = local_1a0[4];
    local_c0 = &local_258;
    local_68 = (long)local_c4 * (long)local_c8 * local_e0;
    local_130 = &local_258;
    this = (binary_op_atan2 *)&local_258;
    local_1d0 = 0;
    local_1d4 = 0;
    local_1d8 = 0;
    local_1dc = 0;
    local_1f0 = 0;
    local_1f8 = 0;
    local_200 = 0;
    local_208 = 0;
    local_6c = 0x10;
    local_7c = 0x10;
    local_14c = local_1b8;
    local_14d = 1;
    local_184 = local_1b8;
    local_185 = 1;
    local_1c8 = 0;
    local_1e0 = 0;
    local_258 = 0;
    local_248 = 0;
    local_240 = 0;
    local_230 = 0;
    local_22c = 0;
    local_228 = 0;
    local_224 = 0;
    local_220 = 0;
    local_218 = 0;
    local_250 = 0;
    local_118 = local_194;
    local_128 = local_194;
    uStack_124 = local_194;
    uStack_120 = local_194;
    uStack_11c = local_194;
    local_210 = x;
    local_158 = this;
    local_d8 = x;
    local_a0 = local_1c0;
    local_48 = this;
    local_38 = local_160;
    local_238 = local_f0;
    local_1e8 = local_b8;
    for (local_25c = 0; local_25c + 3 < local_1b4; local_25c = local_25c + 4) {
      pafStack_110 = (__m128 *)local_1c0;
      local_288 = *(__m128 *)local_1c0;
      afVar2 = BinaryOp_x86_functor::binary_op_atan2::func_pack4
                         (local_1a9,&local_288,(__m128 *)local_278);
      local_108 = afVar2._0_8_;
      afVar2[2] = (float)extraout_XMM0_Dc;
      afVar2[0] = (float)(int)local_108;
      afVar2[1] = (float)(int)((ulong)local_108 >> 0x20);
      afVar2[3] = extraout_XMM0_Dd;
      local_f8 = local_210;
      local_288._8_8_ = afVar2._8_8_;
      afStack_100[0] = local_288[2];
      afStack_100[1] = local_288[3];
      *(undefined8 *)local_210 = local_108;
      *(undefined8 *)(local_210 + 2) = local_288._8_8_;
      local_1c0 = (float *)((long)local_1c0 + 0x10);
      local_210 = local_210 + 4;
      local_288 = afVar2;
    }
    for (; local_25c < local_1b4; local_25c = local_25c + 1) {
      fVar1 = BinaryOp_x86_functor::binary_op_atan2::func(this,x,(float *)0x104194a);
      *local_210 = fVar1;
      local_1c0 = local_1c0 + 1;
      local_210 = local_210 + 1;
    }
  }
  return 0;
}

Assistant:

static int binary_op_scalar(const Mat& a, float b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b_avx512 = _mm512_set1_ps(b);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = op.func_pack16(_p, _b_avx512);
            _mm512_storeu_ps(outptr, _p);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b_avx = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = op.func_pack8(_p, _b_avx);
            _mm256_storeu_ps(outptr, _p);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b = _mm_set1_ps(b);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = op.func_pack4(_p, _b);
            _mm_store_ps(outptr, _p);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b);
            ptr++;
            outptr++;
        }
    }

    return 0;
}